

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim_circuit.cpp
# Opt level: O3

void __thiscall lsim::SimCircuit::write_byte(SimCircuit *this,pin_id_container_t *pins,uint8_t data)

{
  pointer puVar1;
  pointer puVar2;
  iterator iVar3;
  ulong uVar4;
  key_type local_2c;
  
  puVar2 = (pins->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (pins->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((long)puVar1 - (long)puVar2 != 0x40) {
    __assert_fail("pins.size() == 8",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_circuit.cpp"
                  ,0xbb,"void lsim::SimCircuit::write_byte(const pin_id_container_t &, uint8_t)");
  }
  if (puVar1 != puVar2) {
    uVar4 = 0;
    do {
      local_2c = *(key_type *)((long)puVar2 + uVar4 * 8 + 4);
      iVar3 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_lsim::SimComponent_*>,_std::allocator<std::pair<const_unsigned_int,_lsim::SimComponent_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->m_components)._M_h,&local_2c);
      if ((iVar3.
           super__Node_iterator_base<std::pair<const_unsigned_int,_lsim::SimComponent_*>,_false>.
           _M_cur == (__node_type *)0x0) ||
         (*(SimComponent **)
           ((long)iVar3.
                  super__Node_iterator_base<std::pair<const_unsigned_int,_lsim::SimComponent_*>,_false>
                  ._M_cur + 0x10) == (SimComponent *)0x0)) {
        __assert_fail("comp",
                      "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_circuit.cpp"
                      ,0xc1,"void lsim::SimCircuit::write_byte(const pin_id_container_t &, uint8_t)"
                     );
      }
      SimComponent::set_user_value
                (*(SimComponent **)
                  ((long)iVar3.
                         super__Node_iterator_base<std::pair<const_unsigned_int,_lsim::SimComponent_*>,_false>
                         ._M_cur + 0x10),
                 (uint32_t)
                 (pins->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar4],
                 (uint)((data >> ((uint)uVar4 & 0x1f) & 1) != 0));
      uVar4 = uVar4 + 1;
      puVar2 = (pins->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(pins->
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3))
    ;
  }
  return;
}

Assistant:

void SimCircuit::write_byte(const pin_id_container_t &pins, uint8_t data) {
    assert(pins.size() == 8);

    for (size_t idx = 0; idx < pins.size(); ++idx) {
        auto value = static_cast<Value>((data >> idx) & 1);

        auto comp = component_by_id(component_id_from_pin_id(pins[idx]));
        assert(comp);
        comp->set_user_value(pin_index_from_pin_id(pins[idx]), value);
    }
}